

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O2

void __thiscall
VoltageDependance::VoltageDependance
          (VoltageDependance *this,double weight,double reversal,string *name,string *type)

{
  allocator<char> local_ca;
  allocator<char> local_c9;
  double local_c8;
  double local_c0;
  string local_b8;
  string local_98;
  Unit local_78;
  
  local_c8 = reversal;
  local_c0 = weight;
  StochasticFunction::StochasticFunction(&this->super_StochasticFunction,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__StochasticProcess_001567f8;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__VoltageDependance_001568a8;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__VoltageDependance_001568f0;
  this->dReversal = local_c8;
  this->dWeight = local_c0;
  (this->super_StochasticFunction).super_StochasticProcess.stochCurrentValue = 0.0;
  std::__cxx11::string::assign
            ((char *)&(this->super_StochasticFunction).super_StochasticProcess.stochDescription);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"m",&local_ca);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"V",&local_c9);
  Unit::Unit(&local_78,&local_98,&local_b8);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,&local_78);
  Unit::~Unit(&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"reversal-potential",&local_ca);
  Parametric::addParameter((Parametric *)this,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"weight",&local_ca);
  Parametric::addParameter((Parametric *)this,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

VoltageDependance::VoltageDependance(double weight, double reversal, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	dReversal = reversal;
	dWeight = weight;
	stochCurrentValue = 0.0;
	stochDescription = "voltage dependance";
	physicalUnit = Unit("m","V");
	addParameter("reversal-potential");
	addParameter("weight");
}